

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_multiple_data_objects.c
# Opt level: O2

wchar_t file_close(archive *a,void *client_data)

{
  close(*client_data);
  archive_mstring_clean((archive_mstring *)((long)client_data + 8));
  free(client_data);
  return L'\0';
}

Assistant:

static int
file_close(struct archive *a, void *data)
{
  struct mydata *mydata = (struct mydata *)data;
  if (mydata == NULL)
    return (ARCHIVE_FATAL);
  file_switch(a, mydata, NULL);
  free(mydata->filename);
  free(mydata);
  return (ARCHIVE_OK);
}